

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double normal_truncated_a_variance(double mu,double s,double a)

{
  double x;
  double dVar1;
  double dVar2;
  __type _Var3;
  double variance;
  double alpha_pdf;
  double alpha_cdf;
  double alpha;
  double a_local;
  double s_local;
  double mu_local;
  
  x = (a - mu) / s;
  dVar1 = normal_01_pdf(x);
  dVar2 = normal_01_cdf(x);
  _Var3 = std::pow<double,int>(dVar1 / (1.0 - dVar2),2);
  return s * s * (((x * dVar1) / (1.0 - dVar2) + 1.0) - _Var3);
}

Assistant:

double normal_truncated_a_variance ( double mu, double s, double a )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_TRUNCATED_A_VARIANCE: variance of the lower truncated Normal PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    21 August 2013
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double MU, S, the mean and standard deviation of the
//    parent Normal distribution.
//
//    Input, double A, the lower truncation limit.
//
//    Output, double NORMAL_TRUNCATED_A_VARIANCE, the variance of the PDF.
//
{
  double alpha;
  double alpha_cdf;
  double alpha_pdf;
  double variance;

  alpha = ( a - mu ) / s;

  alpha_pdf = normal_01_pdf ( alpha );

  alpha_cdf = normal_01_cdf ( alpha );

  variance = s * s * ( 1.0 
    + alpha * alpha_pdf / ( 1.0 - alpha_cdf ) 
    - pow ( alpha_pdf / ( 1.0 - alpha_cdf ), 2 ) );

  return variance;
}